

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O3

void __thiscall JsrtDebugManager::CallDebugEventCallback::AutoClear::~AutoClear(AutoClear *this)

{
  JsrtDebugStackFrames *this_00;
  JsrtDebuggerObjectsManager *this_01;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_02;
  JsrtDebugManager *this_03;
  
  this_03 = this->jsrtDebugManager;
  if (this_03->debuggerObjectsManager != (JsrtDebuggerObjectsManager *)0x0) {
    this_01 = GetDebuggerObjectsManager(this_03);
    JsrtDebuggerObjectsManager::ClearAll(this_01);
    this_03 = this->jsrtDebugManager;
  }
  if (this_03->stackFrames != (JsrtDebugStackFrames *)0x0) {
    this_02 = &GetDebugObjectArena(this_03)->
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    this_00 = this->jsrtDebugManager->stackFrames;
    JsrtDebugStackFrames::~JsrtDebugStackFrames(this_00);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (this_02,this_00,0x10);
    this_03 = this->jsrtDebugManager;
    this_03->stackFrames = (JsrtDebugStackFrames *)0x0;
  }
  this_03->threadContext->debugManager->dispatchHaltFrameAddress = (void *)0x0;
  this->jsrtDebugManager = (JsrtDebugManager *)0x0;
  return;
}

Assistant:

~AutoClear()
        {
            if (jsrtDebugManager->debuggerObjectsManager != nullptr)
            {
                jsrtDebugManager->GetDebuggerObjectsManager()->ClearAll();
            }

            if (jsrtDebugManager->stackFrames != nullptr)
            {
                Adelete(jsrtDebugManager->GetDebugObjectArena(), jsrtDebugManager->stackFrames);
                jsrtDebugManager->stackFrames = nullptr;
            }
            this->jsrtDebugManager->GetThreadContext()->GetDebugManager()->SetDispatchHaltFrameAddress(nullptr);
            this->jsrtDebugManager = nullptr;
        }